

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O2

BOOL LoadOrganya(char *name)

{
  BOOL BVar1;
  char *__s;
  
  if (audio_backend_initialised) {
    BVar1 = OrgData::InitMusicData(&org_data,name);
    if (BVar1) {
      Volume = 100;
      bFadeout = false;
      return true;
    }
    __s = "Audio Data failed to initalize!";
  }
  else {
    __s = "Audio backend failed to initalize!";
  }
  puts(__s);
  return false;
}

Assistant:

BOOL LoadOrganya(const char *name)
{
	if (!audio_backend_initialised) {
		printf("Audio backend failed to initalize!\n");
		return FALSE;
	}

	if (!org_data.InitMusicData(name)) {
		printf("Audio Data failed to initalize!\n");
		return FALSE;
	}

	Volume = 100;
	bFadeout = 0;
	return TRUE;
}